

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cpp
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::AbstractSocketWriter::SendLn
          (AbstractSocketWriter *this,string *message)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *message_local;
  AbstractSocketWriter *this_local;
  
  local_18 = message;
  message_local = (string *)this;
  std::operator+(&local_38,message,"\n");
  (*this->_vptr_AbstractSocketWriter[2])(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void SendLn(const string& message) {
      Send(message + "\n");
    }